

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classinstance.cpp
# Opt level: O3

void __thiscall ClassInstance::ClassInstance(ClassInstance *this,ClassRuntime *classRuntime)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  u2 index;
  ushort uVar3;
  ClassFile *pCVar4;
  char *pcVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  Heap *this_00;
  u2 *puVar8;
  ulong uVar9;
  ulong unaff_R13;
  string fieldDescriptor;
  string fieldName;
  allocator local_a1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
  *local_a0;
  ClassInstance *local_98;
  byte *local_90 [2];
  byte local_80 [16];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  key_type local_50;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_objectType_00130d90;
  this->_classRuntime = classRuntime;
  local_a0 = &this->_fields;
  p_Var1 = &(this->_fields)._M_t._M_impl.super__Rb_tree_header;
  (this->_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_fields)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar4 = ClassRuntime::getClassFile(classRuntime);
  local_98 = this;
  if ((pCVar4->access_flags & 0x400) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"InstantiationError",0x12);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    exit(1);
  }
  uVar3 = pCVar4->fields_count;
  if (uVar3 != 0) {
    puVar8 = &pCVar4->fields->descriptor_index;
    uVar9 = 0;
    do {
      if ((((field_info *)(puVar8 + -2))->access_flags & 0x18) != 0) goto LAB_00122cb1;
      index = *puVar8;
      pcVar5 = getFormattedConstant(pCVar4->constant_pool,puVar8[-1]);
      std::__cxx11::string::string((string *)&local_70,pcVar5,(allocator *)local_90);
      pcVar5 = getFormattedConstant(pCVar4->constant_pool,index);
      std::__cxx11::string::string((string *)local_90,pcVar5,&local_a1);
      bVar2 = *local_90[0];
      unaff_R13 = unaff_R13 & 0xffffffff;
      switch(bVar2) {
      case 0x42:
        unaff_R13 = unaff_R13 | 0x100000000;
        break;
      case 0x43:
        unaff_R13 = unaff_R13 | 0x200000000;
        break;
      case 0x44:
        uVar6 = 0x700000000;
        goto LAB_00122c40;
      case 0x45:
      case 0x47:
      case 0x48:
switchD_00122be0_caseD_45:
        uVar6 = 0x900000000;
        goto LAB_00122c40;
      case 0x46:
        uVar6 = 0x500000000;
        goto LAB_00122c40;
      case 0x49:
        unaff_R13 = unaff_R13 | 0x400000000;
        break;
      case 0x4a:
        uVar6 = 0x600000000;
LAB_00122c40:
        unaff_R13 = unaff_R13 | uVar6;
        break;
      default:
        if (bVar2 == 0x53) {
          uVar6 = 0x300000000;
          goto LAB_00122c40;
        }
        if (bVar2 != 0x5a) goto switchD_00122be0_caseD_45;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_70,local_70 + local_68);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
               ::operator[](local_a0,&local_50);
      pmVar7->printType = (int)unaff_R13;
      pmVar7->type = (int)(unaff_R13 >> 0x20);
      (pmVar7->data).longValue = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0]);
      }
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      uVar3 = pCVar4->fields_count;
LAB_00122cb1:
      uVar9 = uVar9 + 1;
      puVar8 = puVar8 + 8;
    } while (uVar9 < uVar3);
  }
  this_00 = Heap::getInstance();
  Heap::addObject(this_00,&local_98->super_Object);
  return;
}

Assistant:

ClassInstance::ClassInstance(ClassRuntime *classRuntime) : _classRuntime(classRuntime) {
    ClassFile *classFile = classRuntime->getClassFile();
    field_info *fields = classFile->fields;
    u2 abstractFlag = 0x0400;
    
    if ((classFile->access_flags & abstractFlag) != 0) {
        // Não pode instanciar se for classe abstrata (i.e., interface)
        cerr << "InstantiationError" << endl;
        exit(1);
    }
    
    for (int i = 0; i < classFile->fields_count; i++) {
        field_info field = fields[i];
        u2 staticAndFinalFlag = 0x0008 | 0x0010;
        
        if ((field.access_flags & staticAndFinalFlag) == 0) { // não estática e não final
            string fieldName = getFormattedConstant(classFile->constant_pool, field.name_index);
            string fieldDescriptor = getFormattedConstant(classFile->constant_pool, field.descriptor_index);
            
            char fieldType = fieldDescriptor[0];
            Value value;
            
            switch (fieldType) {
                case 'B':
                    value.type = ValueType::BYTE;
                    value.data.byteValue = 0;
                    break;
                case 'C':
                    value.type = ValueType::CHAR;
                    value.data.charValue = 0;
                    break;
                case 'D':
                    value.type = ValueType::DOUBLE;
                    value.data.doubleValue = 0;
                    break;
                case 'F':
                    value.type = ValueType::FLOAT;
                    value.data.floatValue = 0;
                    break;
                case 'I':
                    value.type = ValueType::INT;
                    value.data.intValue = 0;
                    break;
                case 'J':
                    value.type = ValueType::LONG;
                    value.data.longValue = 0;
                    break;
                case 'S':
                    value.type = ValueType::SHORT;
                    value.data.shortValue = 0;
                    break;
                case 'Z':
                    value.type = ValueType::BOOLEAN;
                    value.data.charValue = false;
                    break;
                default:
                    value.type = ValueType::REFERENCE;
                    value.data.object = NULL;
            }
            
            putValueIntoField(value, fieldName);
        }
    }
    
    // quando um objeto é criado, ele precisa ser armazenado na Heap
    Heap &heap = Heap::getInstance();
    heap.addObject(this);
}